

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobalImport(SharedValidator *this,Location *loc,Type type,bool mutable_)

{
  bool bVar1;
  GlobalType local_3c;
  Enum local_30;
  byte local_29;
  Location *pLStack_28;
  bool mutable__local;
  Location *loc_local;
  SharedValidator *this_local;
  Type type_local;
  Result result;
  
  local_29 = mutable_;
  pLStack_28 = loc;
  loc_local = (Location *)this;
  unique0x100000db = type;
  Result::Result((Result *)&type_local,Ok);
  if ((local_29 & 1) != 0) {
    bVar1 = Features::mutable_globals_enabled((Features *)this);
    if (!bVar1) {
      local_30 = (Enum)PrintError(this,pLStack_28,"mutable globals cannot be imported");
      Result::operator|=((Result *)&type_local,(Result)local_30);
    }
  }
  GlobalType::GlobalType(&local_3c,stack0xffffffffffffffec,(bool)(local_29 & 1));
  std::vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
  ::push_back(&this->globals_,&local_3c);
  this->num_imported_globals_ = this->num_imported_globals_ + 1;
  return (Result)type_local.enum_;
}

Assistant:

Result SharedValidator::OnGlobalImport(const Location& loc,
                                       Type type,
                                       bool mutable_) {
  Result result = Result::Ok;
  if (mutable_ && !options_.features.mutable_globals_enabled()) {
    result |= PrintError(loc, "mutable globals cannot be imported");
  }
  globals_.push_back(GlobalType{type, mutable_});
  ++num_imported_globals_;
  return result;
}